

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorprint.cc
# Opt level: O1

void benchmark::ColorPrintf(ostream *out,LogColor color,char *fmt,__va_list_tag *args)

{
  bool bVar1;
  ostream *poVar2;
  __va_list_tag *args_00;
  char *pcVar3;
  string local_40;
  
  if (color - COLOR_RED < 7) {
    args_00 = (__va_list_tag *)
              ((long)&switchD_001342f9::switchdataD_00137644 +
              (long)(int)(&switchD_001342f9::switchdataD_00137644)[color - COLOR_RED]);
    switch(color) {
    case COLOR_RED:
      pcVar3 = "1";
      break;
    case COLOR_GREEN:
      pcVar3 = "2";
      break;
    case COLOR_YELLOW:
      pcVar3 = "3";
      break;
    case COLOR_BLUE:
      pcVar3 = "4";
      break;
    case COLOR_MAGENTA:
      pcVar3 = "5";
      break;
    case COLOR_CYAN:
      pcVar3 = "6";
      break;
    case COLOR_WHITE:
      pcVar3 = "7";
    }
    bVar1 = false;
  }
  else {
    bVar1 = true;
    pcVar3 = (char *)0x0;
    args_00 = args;
  }
  if (!bVar1) {
    FormatString_abi_cxx11_(&local_40,"\x1b[0;3%sm",pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_40._M_dataplus._M_p,local_40._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  FormatString_abi_cxx11_(&local_40,(benchmark *)fmt,(char *)args,args_00);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[m",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ColorPrintf(std::ostream& out, LogColor color, const char* fmt, va_list args) {
#ifdef BENCHMARK_OS_WINDOWS
  ((void)out); // suppress unused warning

  const HANDLE stdout_handle = GetStdHandle(STD_OUTPUT_HANDLE);

  // Gets the current text color.
  CONSOLE_SCREEN_BUFFER_INFO buffer_info;
  GetConsoleScreenBufferInfo(stdout_handle, &buffer_info);
  const WORD old_color_attrs = buffer_info.wAttributes;

  // We need to flush the stream buffers into the console before each
  // SetConsoleTextAttribute call lest it affect the text that is already
  // printed but has not yet reached the console.
  fflush(stdout);
  SetConsoleTextAttribute(stdout_handle,
                          GetPlatformColorCode(color) | FOREGROUND_INTENSITY);
  vprintf(fmt, args);

  fflush(stdout);
  // Restores the text color.
  SetConsoleTextAttribute(stdout_handle, old_color_attrs);
#else
  const char* color_code = GetPlatformColorCode(color);
  if (color_code) out << FormatString("\033[0;3%sm", color_code);
  out << FormatString(fmt, args) << "\033[m";
#endif

}